

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecpp.c
# Opt level: O2

int main(int argc,char **argv)

{
  fppTag *pfVar1;
  char cVar2;
  int iVar3;
  FILE *pFVar4;
  ulong uVar5;
  char *string;
  size_t sVar6;
  char *pcVar7;
  fppTag *pfVar8;
  fppTag *local_2c0;
  fppTag tags [40];
  
  local_2c0 = tags + 1;
  tags[0].tag = 4;
  tags[0].data = anon_var_dwarf_6a06;
  pFVar4 = fopen("cpp.prefs","r");
  if ((pFVar4 == (FILE *)0x0) && (pFVar4 = fopen("$HOME/cpp.prefs","r"), pFVar4 == (FILE *)0x0)) {
LAB_001067e4:
    string = (char *)0x0;
  }
  else {
    fseek(pFVar4,0,2);
    uVar5 = ftell(pFVar4);
    fseek(pFVar4,0,0);
    string = (char *)malloc((ulong)((int)uVar5 + 1));
    if (string == (char *)0x0) {
      fclose(pFVar4);
      goto LAB_001067e4;
    }
    sVar6 = fread(string,1,uVar5 & 0xffffffff,pFVar4);
    string[sVar6] = '\0';
    cVar2 = DoString(&local_2c0,string);
    fclose(pFVar4);
    if (cVar2 == '\0') goto LAB_00106845;
  }
  pcVar7 = getenv("GDLPP_PREFS");
  if ((pcVar7 != (char *)0x0) && (cVar2 = DoString(&local_2c0,pcVar7), cVar2 == '\0')) {
LAB_00106845:
    free(string);
    return 0;
  }
  iVar3 = SetOptions(argc,argv,&local_2c0);
  pfVar1 = local_2c0;
  if (iVar3 == 0) {
    return 0;
  }
  if (2 < argc - iVar3) {
    puts("Too many file arguments. Usage: cpp [options] [input [output]]");
    return -1;
  }
  local_2c0->tag = 0xc;
  local_2c0->data = own_input;
  pfVar8 = local_2c0 + 1;
  if (iVar3 < argc) {
    pcVar7 = argv[iVar3];
    if ((*pcVar7 == '-') && (pcVar7[1] == '\0')) {
      if (display == '\x01') {
        fwrite("cpp: input: [stdin]\n",0x14,1,_stderr);
      }
    }
    else {
      pFVar4 = freopen(pcVar7,"r",_stdin);
      if (pFVar4 == (FILE *)0x0) {
        perror(argv[iVar3]);
        fprintf(_stderr,"Can\'t open input file \"%s\"",argv[iVar3]);
        return -2;
      }
      pfVar1[1].tag = 0xb;
      pfVar1[1].data = argv[iVar3];
      pfVar8 = pfVar1 + 2;
      if (display == '\x01') {
        fprintf(_stderr,"cpp: input: %s\n");
      }
    }
    iVar3 = iVar3 + 1;
  }
  else if (display == '\x01') {
    fwrite("cpp: input: [stdin]\n",0x14,1,_stderr);
  }
  if (iVar3 < argc) {
    pcVar7 = argv[iVar3];
    if ((*pcVar7 != '-') || (pcVar7[1] != '\0')) {
      pFVar4 = freopen(pcVar7,"w",_stdout);
      if (pFVar4 == (FILE *)0x0) {
        perror(argv[iVar3]);
        fprintf(_stderr,"Can\'t open output file \"%s\"",argv[iVar3]);
        return -1;
      }
      if (display == '\x01') {
        fprintf(_stderr,"cpp: output: %s\n",argv[iVar3]);
      }
      goto LAB_0010699a;
    }
  }
  if (display == '\x01') {
    fwrite("cpp: output: [stdout]\n",0x16,1,_stderr);
  }
LAB_0010699a:
  pfVar8->tag = 0xd;
  pfVar8->data = own_output;
  pfVar8[1].tag = 0x10;
  pfVar8[1].data = own_error;
  pfVar8[2].tag = 0;
  pfVar8[2].data = (void *)0x0;
  fppPreProcess(tags);
  free(string);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  struct fppTag tags[MAX_TAGS];
  int i;
  struct fppTag *tagptr = tags;
  char *dealloc;

  /*
   * Append system-specific directories to the include directory list.
   * The include directories will be searched through in the same order
   * as you add them in the taglist!
   * The directory _must_ end with a proper directory speparator!
   */  

  tagptr->tag=FPPTAG_INCLUDE_DIR;
#if defined (AMIGA)
  tagptr->data = "INCLUDE:";
#elif defined (OS9)
  tagptr->data = "/dd/defs/";
#elif defined (WIN32)
  tagptr->data = "";
#else
  tagptr->data = PKGDATADIR;
#endif
  tagptr++;

  if(GetPrefs(&tagptr, &dealloc))
    return(0);

  if( !(i = SetOptions(argc, argv, &tagptr)))
    return(0);
  
  if (argc - i >2) {
    printf("Too many file arguments. Usage: cpp [options] [input [output]]\n");
    return(-1);
  }

  tagptr->tag=FPPTAG_INPUT;
  tagptr->data=(void *)own_input;
  tagptr++;

  if(i<argc) {
    /*
     * Open input file, "-" means use stdin.
     */
    if (strcmp(argv[i], "-")) {
      if (freopen(argv[i], "r", stdin) == NULL) {
	perror(argv[i]);
	fprintf(stderr, "Can't open input file \"%s\"", argv[i]);
	return(-2);
      }
      tagptr->tag=FPPTAG_INPUT_NAME;
      tagptr->data=argv[i];
      tagptr++;
      if(display)
	fprintf(stderr, "cpp: input: %s\n", argv[i]);
    } else				/* Else, just get stdin 	*/
      if(display)
	fprintf(stderr, "cpp: input: [stdin]\n");
    i++;
  } else
    if(display)
      fprintf(stderr, "cpp: input: [stdin]\n");

  if(i<argc) {
    /*
     * Get output file, "-" means use stdout.
     */
    if (strcmp(argv[i], "-")) {
      if (freopen(argv[i], "w", stdout) == NULL) {
	perror(argv[i]);
	fprintf(stderr, "Can't open output file \"%s\"", argv[i]);
	return(-1);
      }
      if(display)
	fprintf(stderr, "cpp: output: %s\n", argv[i]);
    } else
      if(display)
	fprintf(stderr, "cpp: output: [stdout]\n");
  } else
    if(display)
      fprintf(stderr, "cpp: output: [stdout]\n");

  tagptr->tag=FPPTAG_OUTPUT;
  tagptr->data=(void *)own_output;
  tagptr++;

  tagptr->tag=FPPTAG_ERROR;
  tagptr->data=(void *)own_error;
  tagptr++;

  /* The LAST tag: */

  tagptr->tag=FPPTAG_END;
  tagptr->data=0;
  tagptr++;

#if defined(SHARED) && defined(AMIGA)
  if(!(FPPBase=OpenLibrary(FPPNAME, 1))) {
    printf("Error opening %s!\n", FPPNAME);
    return(-1);
  }
#endif
  fppPreProcess(tags);

#if defined(SHARED) && defined(AMIGA)
  CloseLibrary((struct Library *)FPPBase);
#endif
  /*
   * Preprocess ready!
   */

  if( dealloc )
    free( dealloc );

  return(0);
}